

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

int __thiscall CTcSymLocalBase::get_ctx_arr_idx(CTcSymLocalBase *this)

{
  CTcSymLocalBase *pCVar1;
  
  do {
    pCVar1 = this;
    this = &pCVar1->ctx_orig_->super_CTcSymLocalBase;
  } while (this != (CTcSymLocalBase *)0x0);
  return pCVar1->ctx_arr_idx_;
}

Assistant:

int CTcSymLocalBase::get_ctx_arr_idx() const
{
    /* 
     *   if I'm based on an original symbol from another scope, use the
     *   same property ID as the original symbol 
     */
    if (ctx_orig_ != 0)
        return ctx_orig_->get_ctx_arr_idx();

    /* return my context property */
    return ctx_arr_idx_;
}